

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O2

void __thiscall Omega_h::Write<long>::set(Write<long> *this,LO i,long value)

{
  ScopedTimer timer;
  ScopedTimer local_19;
  
  begin_code("single host to device",(char *)0x0);
  *(long *)((long)(this->shared_alloc_).direct_ptr + (long)i * 8) = value;
  ScopedTimer::~ScopedTimer(&local_19);
  return;
}

Assistant:

void Write<T>::set(LO i, T value) const {
  ScopedTimer timer("single host to device");
#ifdef OMEGA_H_CHECK_BOUNDS
    OMEGA_H_CHECK(0 <= i);
    OMEGA_H_CHECK(i < size());
#endif
#ifdef OMEGA_H_USE_CUDA
  cudaMemcpy(data() + i, &value, sizeof(T), cudaMemcpyHostToDevice);
#else
  operator[](i) = value;
#endif
}